

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O1

vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_> * __thiscall
flow::convert<flow::util::Cidr,flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>
          (vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_> *__return_storage_ptr__,
          flow *this,vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *source)

{
  long lVar1;
  long lVar2;
  pointer pCVar3;
  int iVar4;
  long lVar5;
  size_t __n;
  char *pcVar6;
  undefined8 *puVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  byte bVar11;
  int local_80;
  char local_7c [46];
  undefined1 local_4e [22];
  undefined8 local_38;
  
  bVar11 = 0;
  std::vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>::vector
            (__return_storage_ptr__,*(long *)(this + 8) - *(long *)this >> 3,
             (allocator_type *)&local_80);
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)this;
  if (lVar1 - lVar2 != 0) {
    lVar9 = 0x48;
    lVar10 = 0;
    do {
      puVar7 = (undefined8 *)(*(long *)(*(long *)this + lVar10 * 8) + 0x48);
      piVar8 = &local_80;
      for (lVar5 = 10; iVar4 = local_80, lVar5 != 0; lVar5 = lVar5 + -1) {
        *(undefined8 *)piVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
        piVar8 = piVar8 + ((ulong)bVar11 * -2 + 1) * 2;
      }
      pCVar3 = (__return_storage_ptr__->
               super__Vector_base<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pcVar6 = (char *)((long)(&pCVar3->ipaddr_ + -1) + lVar9);
      *(int *)(pcVar6 + -4) = local_80;
      strncpy(pcVar6,local_7c,0x2e);
      pcVar6 = (pCVar3->ipaddr_).cstr_ + lVar9 + -4;
      __n = 0x10;
      if (iVar4 == 2) {
        __n = 4;
      }
      memcpy(pcVar6 + -0x16,local_4e,__n);
      *(undefined8 *)pcVar6 = local_38;
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0x50;
    } while (lVar1 - lVar2 >> 3 != lVar10);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> convert(const std::vector<Constant*>& source) {
  std::vector<T> target(source.size());

  for (size_t i = 0, e = source.size(); i != e; ++i)
    target[i] = static_cast<S*>(source[i])->get();

  return target;
}